

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mif_cod.c
# Opt level: O1

int mif_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  jas_image_cmpt_t *pjVar1;
  uchar *puVar2;
  jas_seqent_t **ppjVar3;
  int_fast16_t iVar4;
  int fmt;
  uint uVar5;
  int iVar6;
  mif_hdr_t *hdr;
  mif_cmpt_t *pmVar7;
  jas_image_t *image_00;
  jas_matrix_t *data;
  long lVar8;
  long lVar9;
  jas_matrix_t *matrix;
  jas_matrix_t *pjVar10;
  long lVar11;
  jas_image_cmptparm_t local_68;
  
  if ((optstr != (char *)0x0) && (*optstr != '\0')) {
    jas_eprintf("warning: ignoring unsupported options\n");
  }
  fmt = jas_image_strtofmt("pnm");
  if (fmt < 0) {
    jas_eprintf("error: PNM support required\n");
  }
  else {
    hdr = mif_hdr_create(image->numcmpts_);
    if (hdr == (mif_hdr_t *)0x0) {
LAB_0013306a:
      hdr = (mif_hdr_t *)0x0;
    }
    else {
      hdr->magic = 0x4d49460a;
      uVar5 = image->numcmpts_;
      hdr->numcmpts = uVar5;
      if (0 < (int)uVar5) {
        lVar11 = 0;
        do {
          pmVar7 = (mif_cmpt_t *)jas_malloc(0x48);
          hdr->cmpts[lVar11] = pmVar7;
          if (pmVar7 == (mif_cmpt_t *)0x0) {
            if (0 < hdr->numcmpts) {
              lVar11 = 0;
              do {
                if (hdr->cmpts[lVar11] != (mif_cmpt_t *)0x0) {
                  jas_free(hdr->cmpts[lVar11]);
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < hdr->numcmpts);
            }
            jas_free(hdr);
            goto LAB_0013306a;
          }
          pmVar7 = hdr->cmpts[lVar11];
          pjVar1 = image->cmpts_[lVar11];
          pmVar7->tlx = pjVar1->tlx_;
          pmVar7->tly = pjVar1->tly_;
          pmVar7->width = pjVar1->width_;
          pmVar7->height = pjVar1->height_;
          pmVar7->sampperx = pjVar1->hstep_;
          pmVar7->samppery = pjVar1->vstep_;
          pmVar7->prec = (long)pjVar1->prec_;
          pmVar7->sgnd = (long)pjVar1->sgnd_;
          pmVar7->data = (char *)0x0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < hdr->numcmpts);
      }
    }
    if (hdr != (mif_hdr_t *)0x0) {
      uVar5 = out->flags_;
      if ((uVar5 & 7) == 0) {
        if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
          *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
          iVar6 = out->cnt_;
          out->cnt_ = iVar6 + -1;
          if (iVar6 < 1) {
            iVar6 = jas_stream_flushbuf(out,0x4d);
            if (iVar6 == -1) goto LAB_00133083;
          }
          else {
            out->rwcnt_ = out->rwcnt_ + 1;
            puVar2 = out->ptr_;
            out->ptr_ = puVar2 + 1;
            *puVar2 = 'M';
          }
          uVar5 = out->flags_;
          if ((uVar5 & 7) != 0) goto LAB_00133083;
          if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
            *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
            iVar6 = out->cnt_;
            out->cnt_ = iVar6 + -1;
            if (iVar6 < 1) {
              iVar6 = jas_stream_flushbuf(out,0x49);
              if (iVar6 == -1) goto LAB_00133083;
            }
            else {
              out->rwcnt_ = out->rwcnt_ + 1;
              puVar2 = out->ptr_;
              out->ptr_ = puVar2 + 1;
              *puVar2 = 'I';
            }
            uVar5 = out->flags_;
            if ((uVar5 & 7) != 0) goto LAB_00133083;
            if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
              *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
              iVar6 = out->cnt_;
              out->cnt_ = iVar6 + -1;
              if (iVar6 < 1) {
                iVar6 = jas_stream_flushbuf(out,0x46);
                if (iVar6 == -1) goto LAB_00133083;
              }
              else {
                out->rwcnt_ = out->rwcnt_ + 1;
                puVar2 = out->ptr_;
                out->ptr_ = puVar2 + 1;
                *puVar2 = 'F';
              }
              uVar5 = out->flags_;
              if ((uVar5 & 7) != 0) goto LAB_00133083;
              if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
                *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
                iVar6 = out->cnt_;
                out->cnt_ = iVar6 + -1;
                if (iVar6 < 1) {
                  iVar6 = jas_stream_flushbuf(out,10);
                  if (iVar6 == -1) goto LAB_00133083;
                }
                else {
                  out->rwcnt_ = out->rwcnt_ + 1;
                  puVar2 = out->ptr_;
                  out->ptr_ = puVar2 + 1;
                  *puVar2 = '\n';
                }
                if (0 < hdr->numcmpts) {
                  lVar11 = 0;
                  do {
                    pmVar7 = hdr->cmpts[lVar11];
                    jas_stream_printf(out,
                                      "component tlx=%ld tly=%ld sampperx=%ld samppery=%ld width=%ld height=%ld prec=%d sgnd=%d"
                                      ,pmVar7->tlx,pmVar7->tly,pmVar7->sampperx,pmVar7->samppery,
                                      pmVar7->width,(int)pmVar7->height,(int)pmVar7->prec,
                                      (int)pmVar7->sgnd);
                    if (pmVar7->data != (char *)0x0) {
                      jas_stream_printf(out," data=%s");
                    }
                    jas_stream_printf(out,"\n");
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < hdr->numcmpts);
                }
                jas_stream_printf(out,"end\n");
                if (0 < hdr->numcmpts) {
                  pjVar10 = (jas_matrix_t *)0x0;
                  lVar11 = 0;
                  do {
                    pmVar7 = hdr->cmpts[lVar11];
                    if (pmVar7->data == (char *)0x0) {
                      image_00 = jas_image_create0();
                      if (image_00 == (jas_image_t *)0x0) {
                        image_00 = (jas_image_t *)0x0;
                        matrix = (jas_matrix_t *)0x0;
                        goto LAB_00133086;
                      }
                      local_68.tlx = 0;
                      local_68.tly = 0;
                      local_68.hstep = pmVar7->sampperx;
                      local_68.vstep = pmVar7->samppery;
                      local_68.width = pmVar7->width;
                      local_68.height = pmVar7->height;
                      local_68.prec = (int)pmVar7->prec;
                      local_68.sgnd = 0;
                      iVar6 = jas_image_addcmpt(image_00,image_00->numcmpts_,&local_68);
                      matrix = pjVar10;
                      if (iVar6 != 0) goto LAB_00133086;
                      image_00->clrspc_ = 0x301;
                      (*image_00->cmpts_)->type_ = 0;
                      data = jas_seq2d_create(0,0,pmVar7->width,pmVar7->height);
                      if ((data == (jas_matrix_t *)0x0) ||
                         (iVar6 = jas_image_readcmpt(image,(uint)lVar11,0,0,pmVar7->width,
                                                     pmVar7->height,data), matrix = data, iVar6 != 0
                         )) goto LAB_00133086;
                      if ((pmVar7->sgnd != 0) && (0 < pmVar7->height)) {
                        iVar4 = pmVar7->prec;
                        lVar8 = 0;
                        do {
                          if (0 < pmVar7->width) {
                            ppjVar3 = data->rows_;
                            lVar9 = 0;
                            do {
                              ppjVar3[lVar8 - data->ystart_][lVar9 - data->xstart_] =
                                   ppjVar3[lVar8 - data->ystart_][lVar9 - data->xstart_] +
                                   (long)(1 << ((char)iVar4 - 1U & 0x1f));
                              lVar9 = lVar9 + 1;
                            } while (lVar9 < pmVar7->width);
                          }
                          lVar8 = lVar8 + 1;
                        } while (lVar8 < pmVar7->height);
                      }
                      iVar6 = jas_image_writecmpt(image_00,0,0,0,pmVar7->width,pmVar7->height,data);
                      if (iVar6 != 0) goto LAB_00133086;
                      jas_matrix_destroy(data);
                      iVar6 = jas_image_encode(image_00,out,fmt,(char *)0x0);
                      matrix = pjVar10;
                      if (iVar6 != 0) goto LAB_00133086;
                      jas_image_destroy(image_00);
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < hdr->numcmpts);
                }
                mif_hdr_destroy(hdr);
                return 0;
              }
            }
          }
        }
        out->flags_ = uVar5 | 4;
      }
      goto LAB_00133083;
    }
  }
  hdr = (mif_hdr_t *)0x0;
LAB_00133083:
  image_00 = (jas_image_t *)0x0;
  matrix = (jas_matrix_t *)0x0;
LAB_00133086:
  if (hdr != (mif_hdr_t *)0x0) {
    mif_hdr_destroy(hdr);
  }
  if (image_00 != (jas_image_t *)0x0) {
    jas_image_destroy(image_00);
  }
  if (matrix != (jas_matrix_t *)0x0) {
    jas_matrix_destroy(matrix);
  }
  return -1;
}

Assistant:

int mif_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	mif_hdr_t *hdr;
	jas_image_t *tmpimage;
	int fmt;
	int cmptno;
	mif_cmpt_t *cmpt;
	jas_image_cmptparm_t cmptparm;
	jas_seq2d_t *data;
	int_fast32_t x;
	int_fast32_t y;
	int bias;

	hdr = 0;
	tmpimage = 0;
	data = 0;

	if (optstr && *optstr != '\0') {
		jas_eprintf("warning: ignoring unsupported options\n");
	}

	if ((fmt = jas_image_strtofmt("pnm")) < 0) {
		jas_eprintf("error: PNM support required\n");
		goto error;
	}

	if (!(hdr = mif_makehdrfromimage(image))) {
		goto error;
	}
	if (mif_hdr_put(hdr, out)) {
		goto error;
	}

	/* Output component data. */
	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		cmpt = hdr->cmpts[cmptno];
		if (!cmpt->data) {
			if (!(tmpimage = jas_image_create0())) {
				goto error;
			}	
			cmptparm.tlx = 0;
			cmptparm.tly = 0;
			cmptparm.hstep = cmpt->sampperx;
			cmptparm.vstep = cmpt->samppery;
			cmptparm.width = cmpt->width;
			cmptparm.height = cmpt->height;
			cmptparm.prec = cmpt->prec;
			cmptparm.sgnd = false;
			if (jas_image_addcmpt(tmpimage, jas_image_numcmpts(tmpimage),
			  &cmptparm)) {
				goto error;
			}
			jas_image_setclrspc(tmpimage, JAS_CLRSPC_SGRAY);
			jas_image_setcmpttype(tmpimage, 0,
			  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
			if (!(data = jas_seq2d_create(0, 0, cmpt->width, cmpt->height))) {
				goto error;
			}
			if (jas_image_readcmpt(image, cmptno, 0, 0, cmpt->width,
			  cmpt->height, data)) {
				goto error;
			}
			if (cmpt->sgnd) {
				bias = 1 << (cmpt->prec - 1);
				for (y = 0; y < cmpt->height; ++y) {
					for (x = 0; x < cmpt->width; ++x) {
						*jas_seq2d_getref(data, x, y) += bias;
					}
				}
			}
			if (jas_image_writecmpt(tmpimage, 0, 0, 0, cmpt->width,
			  cmpt->height, data)) {
				goto error;
			}
			jas_seq2d_destroy(data);
			data = 0;
			if (jas_image_encode(tmpimage, out, fmt, 0)) {
				goto error;
			}
			jas_image_destroy(tmpimage);
			tmpimage = 0;
		}
	}

	mif_hdr_destroy(hdr);

	return 0;

error:
	if (hdr) {
		mif_hdr_destroy(hdr);
	}
	if (tmpimage) {
		jas_image_destroy(tmpimage);
	}
	if (data) {
		jas_seq2d_destroy(data);
	}
	return -1;
}